

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::load_merkle_trees
          (torrent *this,vector<std::vector<sha256_hash>,_file_index_t> *trees_import,
          vector<bitfield,_file_index_t> *mask,vector<bitfield,_file_index_t> *verified)

{
  pointer pvVar1;
  pointer pbVar2;
  int *piVar3;
  digest32<256L> *pdVar4;
  bool bVar5;
  file_index_t fVar6;
  file_storage *this_00;
  int64_t iVar7;
  size_t sVar8;
  file_index_t i;
  long lVar9;
  bitfield *verified_00;
  long lVar10;
  long lVar11;
  span<const_libtorrent::digest32<256L>_> t;
  span<const_libtorrent::digest32<256L>_> t_00;
  long local_60;
  bitfield empty_verified;
  
  this_00 = torrent_info::orig_files
                      ((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  empty_verified.m_buf.super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (unique_ptr<unsigned_int[],_long>)
       (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)0x0;
  lVar10 = 1;
  lVar11 = 0;
  local_60 = 0;
  lVar9 = 0;
  while( true ) {
    fVar6 = file_storage::end_file(this_00);
    if (fVar6.m_val <= lVar9) break;
    bVar5 = file_storage::pad_file_at(this_00,(file_index_t)(int)lVar9);
    if (!bVar5) {
      iVar7 = file_storage::file_size(this_00,(file_index_t)(int)lVar9);
      if (iVar7 != 0) {
        pvVar1 = (trees_import->
                 super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                 ).
                 super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((int)(((long)(trees_import->
                         super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                         ).
                         super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= lVar9
           ) break;
        pbVar2 = (verified->
                 super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
                 super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        verified_00 = (bitfield *)
                      ((long)&(pbVar2->m_buf).
                              super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                      + lVar11);
        if ((int)((ulong)((long)(verified->
                                super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                ).
                                super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >> 3) <=
            lVar9) {
          verified_00 = &empty_verified;
        }
        pbVar2 = (mask->super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
                 super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (((lVar9 < (int)((ulong)((long)(mask->
                                          super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                          ).
                                          super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)
                           >> 3)) &&
            (piVar3 = *(int **)((long)&(pbVar2->m_buf).
                                       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                               + lVar11), piVar3 != (int *)0x0)) && (*piVar3 != 0)) {
          sVar8 = merkle_tree::size((merkle_tree *)
                                    ((long)&((this->m_merkle_trees).
                                             super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                             .
                                             super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_root +
                                    local_60));
          bitfield::resize((bitfield *)
                           ((long)&(pbVar2->m_buf).
                                   super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                           + lVar11),(int)sVar8);
          pvVar1 = (trees_import->
                   super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                   ).
                   super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar4 = *(digest32<256L> **)((long)pvVar1 + lVar10 * 8 + -8);
          t.m_len = *(long *)((long)&(pvVar1->
                                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                     )._M_impl + lVar10 * 8) - (long)pdVar4 >> 5;
          t.m_ptr = pdVar4;
          merkle_tree::load_sparse_tree
                    ((merkle_tree *)
                     ((long)&((this->m_merkle_trees).
                              super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                              .
                              super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_root + local_60),t,
                     (bitfield *)
                     ((long)&(((mask->
                               super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                               ).
                               super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_buf).
                             super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                     + lVar11),verified_00);
        }
        else {
          pdVar4 = *(digest32<256L> **)((long)pvVar1 + lVar10 * 8 + -8);
          t_00.m_len = *(long *)((long)&(pvVar1->
                                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                        )._M_impl + lVar10 * 8) - (long)pdVar4 >> 5;
          t_00.m_ptr = pdVar4;
          merkle_tree::load_tree
                    ((merkle_tree *)
                     ((long)&((this->m_merkle_trees).
                              super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                              .
                              super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_root + local_60),t_00,
                     verified_00);
        }
      }
    }
    lVar9 = lVar9 + 1;
    lVar10 = lVar10 + 3;
    local_60 = local_60 + 0x30;
    lVar11 = lVar11 + 8;
  }
  ::std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&empty_verified);
  return;
}

Assistant:

void torrent::load_merkle_trees(
		aux::vector<std::vector<sha256_hash>, file_index_t> trees_import
		, aux::vector<bitfield, file_index_t> mask
		, aux::vector<bitfield, file_index_t> verified)
	{
		auto const& fs = m_torrent_file->orig_files();

		bitfield const empty_verified;
		for (file_index_t i{0}; i < fs.end_file(); ++i)
		{
			if (fs.pad_file_at(i) || fs.file_size(i) == 0)
				continue;

			if (i >= trees_import.end_index()) break;
			bitfield const& verified_bitmask = (i >= verified.end_index()) ? empty_verified : verified[i];
			if (i < mask.end_index() && !mask[i].empty())
			{
				mask[i].resize(int(m_merkle_trees[i].size()));
				m_merkle_trees[i].load_sparse_tree(trees_import[i], mask[i], verified_bitmask);
			}
			else
			{
				m_merkle_trees[i].load_tree(trees_import[i], verified_bitmask);
			}
		}
	}